

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_store_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LocalSingleStoreElimPass::InitExtensionAllowList(LocalSingleStoreElimPass *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7c8;
  allocator<char> local_7bb;
  allocator<char> local_7ba;
  allocator<char> local_7b9;
  allocator<char> local_7b8;
  allocator<char> local_7b7;
  allocator<char> local_7b6;
  allocator<char> local_7b5;
  allocator<char> local_7b4;
  allocator<char> local_7b3;
  allocator<char> local_7b2;
  allocator<char> local_7b1;
  allocator<char> local_7b0;
  allocator<char> local_7af;
  allocator<char> local_7ae;
  allocator<char> local_7ad;
  allocator<char> local_7ac;
  allocator<char> local_7ab;
  allocator<char> local_7aa;
  allocator<char> local_7a9;
  allocator<char> local_7a8;
  allocator<char> local_7a7;
  allocator<char> local_7a6;
  allocator<char> local_7a5;
  allocator<char> local_7a4;
  allocator<char> local_7a3;
  allocator<char> local_7a2;
  allocator<char> local_7a1;
  allocator<char> local_7a0;
  allocator<char> local_79f;
  allocator<char> local_79e;
  allocator<char> local_79d;
  allocator<char> local_79c;
  allocator<char> local_79b;
  allocator<char> local_79a;
  allocator<char> local_799;
  allocator<char> local_798;
  allocator<char> local_797;
  allocator<char> local_796;
  allocator<char> local_795;
  allocator<char> local_794;
  allocator<char> local_793;
  allocator<char> local_792;
  allocator<char> local_791;
  allocator<char> local_790;
  allocator<char> local_78f;
  allocator<char> local_78e;
  allocator<char> local_78d;
  allocator<char> local_78c;
  allocator<char> local_78b;
  allocator<char> local_78a;
  allocator<char> local_789;
  allocator<char> local_788;
  allocator<char> local_787;
  allocator<char> local_786;
  allocator<char> local_785;
  allocator<char> local_784;
  allocator<char> local_783;
  allocator<char> local_782;
  allocator<char> local_781;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  string asStack_760 [32];
  string asStack_740 [32];
  string asStack_720 [32];
  string asStack_700 [32];
  string asStack_6e0 [32];
  string asStack_6c0 [32];
  string asStack_6a0 [32];
  string asStack_680 [32];
  string asStack_660 [32];
  string asStack_640 [32];
  string asStack_620 [32];
  string asStack_600 [32];
  string asStack_5e0 [32];
  string asStack_5c0 [32];
  string asStack_5a0 [32];
  string asStack_580 [32];
  string asStack_560 [32];
  string asStack_540 [32];
  string asStack_520 [32];
  string asStack_500 [32];
  string asStack_4e0 [32];
  string asStack_4c0 [32];
  string asStack_4a0 [32];
  string asStack_480 [32];
  string asStack_460 [32];
  string asStack_440 [32];
  string asStack_420 [32];
  string asStack_400 [32];
  string asStack_3e0 [32];
  string asStack_3c0 [32];
  string asStack_3a0 [32];
  string asStack_380 [32];
  string asStack_360 [32];
  string asStack_340 [32];
  string asStack_320 [32];
  string asStack_300 [32];
  string asStack_2e0 [32];
  string asStack_2c0 [32];
  string asStack_2a0 [32];
  string asStack_280 [32];
  string asStack_260 [32];
  string asStack_240 [32];
  string asStack_220 [32];
  string asStack_200 [32];
  string asStack_1e0 [32];
  string asStack_1c0 [32];
  string asStack_1a0 [32];
  string asStack_180 [32];
  string asStack_160 [32];
  string asStack_140 [32];
  string asStack_120 [32];
  string asStack_100 [32];
  string asStack_e0 [32];
  string asStack_c0 [32];
  string asStack_a0 [32];
  string asStack_80 [32];
  string asStack_60 [32];
  string asStack_40 [32];
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  LocalSingleStoreElimPass *this_local;
  
  local_10 = (undefined1  [8])this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_780,"SPV_AMD_shader_explicit_vertex_parameter",&local_781);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_760,"SPV_AMD_shader_trinary_minmax",&local_782);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_740,"SPV_AMD_gcn_shader",&local_783);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_720,"SPV_KHR_shader_ballot",&local_784)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_700,"SPV_AMD_shader_ballot",&local_785)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_6e0,"SPV_AMD_gpu_shader_half_float",&local_786);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_6c0,"SPV_KHR_shader_draw_parameters",&local_787);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_6a0,"SPV_KHR_subgroup_vote",&local_788)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_680,"SPV_KHR_8bit_storage",&local_789);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_660,"SPV_KHR_16bit_storage",&local_78a)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_640,"SPV_KHR_device_group",&local_78b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_620,"SPV_KHR_multiview",&local_78c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_600,"SPV_NVX_multiview_per_view_attributes",&local_78d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_5e0,"SPV_NV_viewport_array2",&local_78e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_5c0,"SPV_NV_stereo_view_rendering",&local_78f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_5a0,"SPV_NV_sample_mask_override_coverage",&local_790);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_580,"SPV_NV_geometry_shader_passthrough",&local_791);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_560,"SPV_AMD_texture_gather_bias_lod",&local_792);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_540,"SPV_KHR_storage_buffer_storage_class",&local_793);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_520,"SPV_KHR_variable_pointers",&local_794);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_500,"SPV_AMD_gpu_shader_int16",&local_795);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_4e0,"SPV_KHR_post_depth_coverage",&local_796);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_4c0,"SPV_KHR_shader_atomic_counter_ops",&local_797);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_4a0,"SPV_EXT_shader_stencil_export",&local_798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_480,"SPV_EXT_shader_viewport_index_layer",&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_460,"SPV_AMD_shader_image_load_store_lod",&local_79a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_440,"SPV_AMD_shader_fragment_mask",&local_79b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_420,"SPV_EXT_fragment_fully_covered",&local_79c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_400,"SPV_AMD_gpu_shader_half_float_fetch",&local_79d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_3e0,"SPV_GOOGLE_decorate_string",&local_79e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_3c0,"SPV_GOOGLE_hlsl_functionality1",&local_79f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_3a0,"SPV_NV_shader_subgroup_partitioned",&local_7a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_380,"SPV_EXT_descriptor_indexing",&local_7a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_360,"SPV_NV_fragment_shader_barycentric",&local_7a2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_340,"SPV_NV_compute_shader_derivatives",&local_7a3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_320,"SPV_NV_shader_image_footprint",&local_7a4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_300,"SPV_NV_shading_rate",&local_7a5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_2e0,"SPV_NV_mesh_shader",&local_7a6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_2c0,"SPV_EXT_mesh_shader",&local_7a7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_2a0,"SPV_NV_ray_tracing",&local_7a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_280,"SPV_KHR_ray_query",&local_7a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_260,"SPV_EXT_fragment_invocation_density",&local_7aa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_240,"SPV_EXT_physical_storage_buffer",&local_7ab);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_220,"SPV_KHR_physical_storage_buffer",&local_7ac);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_200,"SPV_KHR_terminate_invocation",&local_7ad);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_1e0,"SPV_KHR_subgroup_uniform_control_flow",&local_7ae);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_1c0,"SPV_KHR_integer_dot_product",&local_7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_1a0,"SPV_EXT_shader_image_int64",&local_7b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_180,"SPV_KHR_non_semantic_info",&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_160,"SPV_KHR_uniform_group_instructions",&local_7b2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_140,"SPV_KHR_fragment_shader_barycentric",&local_7b3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_120,"SPV_KHR_vulkan_memory_model",&local_7b4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_100,"SPV_NV_bindless_texture",&local_7b5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_e0,"SPV_EXT_shader_atomic_float_add",&local_7b6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_c0,"SPV_EXT_fragment_shader_interlock",&local_7b7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_a0,"SPV_NV_compute_shader_derivatives",&local_7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_80,"SPV_NV_cooperative_matrix",&local_7b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_60,"SPV_KHR_cooperative_matrix",&local_7ba);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_40,"SPV_KHR_ray_tracing_position_fetch",&local_7bb);
  local_20 = &local_780;
  local_18 = 0x3b;
  __l._M_len = 0x3b;
  __l._M_array = local_20;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&this->extensions_allowlist_,__l);
  local_7c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    local_7c8 = local_7c8 + -1;
    std::__cxx11::string::~string((string *)local_7c8);
  } while (local_7c8 != &local_780);
  std::allocator<char>::~allocator(&local_7bb);
  std::allocator<char>::~allocator(&local_7ba);
  std::allocator<char>::~allocator(&local_7b9);
  std::allocator<char>::~allocator(&local_7b8);
  std::allocator<char>::~allocator(&local_7b7);
  std::allocator<char>::~allocator(&local_7b6);
  std::allocator<char>::~allocator(&local_7b5);
  std::allocator<char>::~allocator(&local_7b4);
  std::allocator<char>::~allocator(&local_7b3);
  std::allocator<char>::~allocator(&local_7b2);
  std::allocator<char>::~allocator(&local_7b1);
  std::allocator<char>::~allocator(&local_7b0);
  std::allocator<char>::~allocator(&local_7af);
  std::allocator<char>::~allocator(&local_7ae);
  std::allocator<char>::~allocator(&local_7ad);
  std::allocator<char>::~allocator(&local_7ac);
  std::allocator<char>::~allocator(&local_7ab);
  std::allocator<char>::~allocator(&local_7aa);
  std::allocator<char>::~allocator(&local_7a9);
  std::allocator<char>::~allocator(&local_7a8);
  std::allocator<char>::~allocator(&local_7a7);
  std::allocator<char>::~allocator(&local_7a6);
  std::allocator<char>::~allocator(&local_7a5);
  std::allocator<char>::~allocator(&local_7a4);
  std::allocator<char>::~allocator(&local_7a3);
  std::allocator<char>::~allocator(&local_7a2);
  std::allocator<char>::~allocator(&local_7a1);
  std::allocator<char>::~allocator(&local_7a0);
  std::allocator<char>::~allocator(&local_79f);
  std::allocator<char>::~allocator(&local_79e);
  std::allocator<char>::~allocator(&local_79d);
  std::allocator<char>::~allocator(&local_79c);
  std::allocator<char>::~allocator(&local_79b);
  std::allocator<char>::~allocator(&local_79a);
  std::allocator<char>::~allocator(&local_799);
  std::allocator<char>::~allocator(&local_798);
  std::allocator<char>::~allocator(&local_797);
  std::allocator<char>::~allocator(&local_796);
  std::allocator<char>::~allocator(&local_795);
  std::allocator<char>::~allocator(&local_794);
  std::allocator<char>::~allocator(&local_793);
  std::allocator<char>::~allocator(&local_792);
  std::allocator<char>::~allocator(&local_791);
  std::allocator<char>::~allocator(&local_790);
  std::allocator<char>::~allocator(&local_78f);
  std::allocator<char>::~allocator(&local_78e);
  std::allocator<char>::~allocator(&local_78d);
  std::allocator<char>::~allocator(&local_78c);
  std::allocator<char>::~allocator(&local_78b);
  std::allocator<char>::~allocator(&local_78a);
  std::allocator<char>::~allocator(&local_789);
  std::allocator<char>::~allocator(&local_788);
  std::allocator<char>::~allocator(&local_787);
  std::allocator<char>::~allocator(&local_786);
  std::allocator<char>::~allocator(&local_785);
  std::allocator<char>::~allocator(&local_784);
  std::allocator<char>::~allocator(&local_783);
  std::allocator<char>::~allocator(&local_782);
  std::allocator<char>::~allocator(&local_781);
  return;
}

Assistant:

void LocalSingleStoreElimPass::InitExtensionAllowList() {
  extensions_allowlist_.insert({"SPV_AMD_shader_explicit_vertex_parameter",
                                "SPV_AMD_shader_trinary_minmax",
                                "SPV_AMD_gcn_shader",
                                "SPV_KHR_shader_ballot",
                                "SPV_AMD_shader_ballot",
                                "SPV_AMD_gpu_shader_half_float",
                                "SPV_KHR_shader_draw_parameters",
                                "SPV_KHR_subgroup_vote",
                                "SPV_KHR_8bit_storage",
                                "SPV_KHR_16bit_storage",
                                "SPV_KHR_device_group",
                                "SPV_KHR_multiview",
                                "SPV_NVX_multiview_per_view_attributes",
                                "SPV_NV_viewport_array2",
                                "SPV_NV_stereo_view_rendering",
                                "SPV_NV_sample_mask_override_coverage",
                                "SPV_NV_geometry_shader_passthrough",
                                "SPV_AMD_texture_gather_bias_lod",
                                "SPV_KHR_storage_buffer_storage_class",
                                "SPV_KHR_variable_pointers",
                                "SPV_AMD_gpu_shader_int16",
                                "SPV_KHR_post_depth_coverage",
                                "SPV_KHR_shader_atomic_counter_ops",
                                "SPV_EXT_shader_stencil_export",
                                "SPV_EXT_shader_viewport_index_layer",
                                "SPV_AMD_shader_image_load_store_lod",
                                "SPV_AMD_shader_fragment_mask",
                                "SPV_EXT_fragment_fully_covered",
                                "SPV_AMD_gpu_shader_half_float_fetch",
                                "SPV_GOOGLE_decorate_string",
                                "SPV_GOOGLE_hlsl_functionality1",
                                "SPV_NV_shader_subgroup_partitioned",
                                "SPV_EXT_descriptor_indexing",
                                "SPV_NV_fragment_shader_barycentric",
                                "SPV_NV_compute_shader_derivatives",
                                "SPV_NV_shader_image_footprint",
                                "SPV_NV_shading_rate",
                                "SPV_NV_mesh_shader",
                                "SPV_EXT_mesh_shader",
                                "SPV_NV_ray_tracing",
                                "SPV_KHR_ray_query",
                                "SPV_EXT_fragment_invocation_density",
                                "SPV_EXT_physical_storage_buffer",
                                "SPV_KHR_physical_storage_buffer",
                                "SPV_KHR_terminate_invocation",
                                "SPV_KHR_subgroup_uniform_control_flow",
                                "SPV_KHR_integer_dot_product",
                                "SPV_EXT_shader_image_int64",
                                "SPV_KHR_non_semantic_info",
                                "SPV_KHR_uniform_group_instructions",
                                "SPV_KHR_fragment_shader_barycentric",
                                "SPV_KHR_vulkan_memory_model",
                                "SPV_NV_bindless_texture",
                                "SPV_EXT_shader_atomic_float_add",
                                "SPV_EXT_fragment_shader_interlock",
                                "SPV_NV_compute_shader_derivatives",
                                "SPV_NV_cooperative_matrix",
                                "SPV_KHR_cooperative_matrix",
                                "SPV_KHR_ray_tracing_position_fetch"});
}